

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O0

scfx_rep * sc_dt::div_scfx_rep(scfx_rep *lhs,scfx_rep *rhs,int div_wl)

{
  bool bVar1;
  word wVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  scfx_rep *psVar7;
  scfx_index this;
  int in_EDX;
  scfx_rep *in_RSI;
  scfx_rep *in_RDI;
  scfx_index x1;
  scfx_index x;
  int index;
  int counter;
  int msw_diff;
  scfx_rep remainder;
  int c;
  int result_index;
  int to_shift;
  int msb_res;
  int msb_rhs;
  int msb_lhs;
  scfx_rep *result;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  scfx_index in_stack_ffffffffffffff20;
  scfx_rep *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  byte bVar8;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int local_80;
  int local_5c;
  int local_38 [4];
  scfx_rep *local_28;
  int local_1c;
  scfx_rep *local_18;
  scfx_rep *local_10;
  scfx_rep *local_8;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  psVar7 = (scfx_rep *)scfx_rep::operator_new((size_t)in_stack_ffffffffffffff28);
  scfx_rep::scfx_rep((scfx_rep *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_28 = psVar7;
  bVar1 = scfx_rep::is_nan(local_10);
  if ((((bVar1) || (bVar1 = scfx_rep::is_nan(local_18), bVar1)) ||
      ((bVar1 = scfx_rep::is_inf(local_10), bVar1 && (bVar1 = scfx_rep::is_inf(local_18), bVar1))))
     || ((bVar1 = scfx_rep::is_zero(in_stack_ffffffffffffff28), bVar1 &&
         (bVar1 = scfx_rep::is_zero(in_stack_ffffffffffffff28), bVar1)))) {
    scfx_rep::set_nan((scfx_rep *)in_stack_ffffffffffffff20);
    local_8 = local_28;
  }
  else {
    bVar1 = scfx_rep::is_inf(local_10);
    if ((bVar1) || (bVar1 = scfx_rep::is_zero(in_stack_ffffffffffffff28), bVar1)) {
      scfx_rep::set_inf((scfx_rep *)in_stack_ffffffffffffff20,
                        CONCAT13(in_stack_ffffffffffffff1f,
                                 CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
      local_8 = local_28;
    }
    else {
      bVar1 = scfx_rep::is_zero(in_stack_ffffffffffffff28);
      if ((bVar1) || (bVar1 = scfx_rep::is_inf(local_18), bVar1)) {
        scfx_rep::set_zero((scfx_rep *)in_stack_ffffffffffffff20,
                           CONCAT13(in_stack_ffffffffffffff1f,
                                    CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
        local_8 = local_28;
      }
      else {
        local_1c = local_1c + 1;
        psVar7 = local_28;
        local_38[0] = n_word(local_1c);
        local_38[0] = local_38[0] + 1;
        sc_max<int>(local_38,&min_mant);
        scfx_rep::resize_to((scfx_rep *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                            (int)in_stack_ffffffffffffff28);
        scfx_mant::clear((scfx_mant *)in_stack_ffffffffffffff20);
        local_28->m_sign = local_10->m_sign * local_18->m_sign;
        wVar2 = scfx_mant::operator[](&local_10->m_mant,local_10->m_msw);
        iVar3 = scfx_find_msb((ulong)wVar2);
        iVar6 = local_10->m_wp;
        iVar5 = local_10->m_msw;
        wVar2 = scfx_mant::operator[](&local_18->m_mant,local_18->m_msw);
        iVar4 = scfx_find_msb((ulong)wVar2);
        iVar5 = (iVar3 + (iVar5 - iVar6) * 0x20) -
                (iVar4 + (local_18->m_msw - local_18->m_wp) * 0x20);
        scfx_rep::size((scfx_rep *)0x260883);
        iVar3 = scfx_rep::size((scfx_rep *)0x2608bd);
        iVar6 = iVar5;
        if (iVar5 < 0) {
          iVar6 = iVar5 + 0x1f;
        }
        local_28->m_wp = (iVar3 + (~(iVar5 % 0x20) >> 0x1f)) - (iVar6 >> 5);
        scfx_rep::scfx_rep((scfx_rep *)in_stack_ffffffffffffff20,
                           (scfx_rep *)
                           CONCAT17(in_stack_ffffffffffffff1f,
                                    CONCAT16(in_stack_ffffffffffffff1e,
                                             CONCAT24(in_stack_ffffffffffffff1c,
                                                      in_stack_ffffffffffffff18))));
        scfx_rep::lshift((scfx_rep *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        iVar6 = local_5c;
        iVar5 = scfx_rep::size((scfx_rep *)0x260928);
        if (iVar6 == iVar5 + -1) {
          in_stack_ffffffffffffff44 = scfx_rep::size((scfx_rep *)0x260947);
          scfx_rep::resize_to((scfx_rep *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                              (int)in_stack_ffffffffffffff28);
        }
        if (0 < local_18->m_msw - local_5c) {
          in_stack_ffffffffffffff40 = scfx_rep::size((scfx_rep *)0x2609b0);
          scfx_rep::resize_to((scfx_rep *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                              (int)in_stack_ffffffffffffff28);
        }
        local_80 = local_1c;
        while( true ) {
          bVar8 = 0;
          if (local_80 != 0) {
            in_stack_ffffffffffffff3e = scfx_rep::is_zero(in_stack_ffffffffffffff28);
            bVar8 = in_stack_ffffffffffffff3e ^ 0xff;
          }
          if ((bVar8 & 1) == 0) break;
          in_stack_ffffffffffffff38 =
               compare_msw_ff((scfx_rep *)CONCAT44(iVar5,iVar6),
                              (scfx_rep *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          if (in_stack_ffffffffffffff38 < 1) {
            scfx_rep::set_bin((scfx_rep *)in_stack_ffffffffffffff20,
                              CONCAT13(in_stack_ffffffffffffff1f,
                                       CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)
                                      ));
            sub_with_index(&psVar7->m_mant,iVar5,iVar6,
                           (scfx_mant *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           CONCAT13(bVar8,CONCAT12(in_stack_ffffffffffffff3e,
                                                   in_stack_ffffffffffffff3c)),
                           in_stack_ffffffffffffff38);
          }
          scfx_rep::shift_left
                    ((scfx_rep *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     CONCAT13(bVar8,CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)));
          in_stack_ffffffffffffff34 = scfx_rep::find_lsw(in_stack_ffffffffffffff28);
          local_80 = local_80 + -1;
        }
        if (local_80 == 0) {
          this = scfx_rep::calc_indices(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20.m_bi);
          in_stack_ffffffffffffff20 =
               scfx_rep::calc_indices((scfx_rep *)this,in_stack_ffffffffffffff20.m_bi);
          bVar1 = scfx_rep::o_bit_at((scfx_rep *)
                                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                     (scfx_index *)this);
          if ((bVar1) &&
             (bVar1 = scfx_rep::o_bit_at((scfx_rep *)
                                         CONCAT44(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30),(scfx_index *)this),
             bVar1)) {
            scfx_rep::q_incr((scfx_rep *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (scfx_index *)
                             CONCAT17(bVar8,CONCAT16(in_stack_ffffffffffffff3e,
                                                     CONCAT24(in_stack_ffffffffffffff3c,
                                                              in_stack_ffffffffffffff38))));
          }
          local_28->m_r_flag = true;
        }
        scfx_rep::find_sw((scfx_rep *)in_stack_ffffffffffffff20);
        local_8 = local_28;
        scfx_rep::~scfx_rep((scfx_rep *)0x260bc4);
      }
    }
  }
  return local_8;
}

Assistant:

scfx_rep*
div_scfx_rep( const scfx_rep& lhs, const scfx_rep& rhs, int div_wl )
{
    scfx_rep& result = *new scfx_rep;

    //
    // check for special cases
    //

    if( lhs.is_nan() || rhs.is_nan() || (lhs.is_inf() && rhs.is_inf()) ||
	(lhs.is_zero() && rhs.is_zero()) )
    {
	result.set_nan();
	return &result;
    }

    if( lhs.is_inf() || rhs.is_zero() )
    {
	result.set_inf( lhs.m_sign * rhs.m_sign );
	return &result;
    }

    if( lhs.is_zero() || rhs.is_inf() )
    {
	result.set_zero( lhs.m_sign * rhs.m_sign );
	return &result;
    }

    //
    // do it
    //

    // compute one bit more for rounding
    div_wl ++;

    result.resize_to( sc_max( n_word( div_wl ) + 1, min_mant ) );
    result.m_mant.clear();
    result.m_sign = lhs.m_sign * rhs.m_sign;

    int msb_lhs = scfx_find_msb( lhs.m_mant[lhs.m_msw] )
	        + ( lhs.m_msw - lhs.m_wp ) * bits_in_word;
    int msb_rhs = scfx_find_msb( rhs.m_mant[rhs.m_msw] )
	        + ( rhs.m_msw - rhs.m_wp ) * bits_in_word;

    int msb_res = msb_lhs - msb_rhs;
    int to_shift = -msb_res % bits_in_word;
    int result_index;

    int c = ( msb_res % bits_in_word >= 0 ) ? 1 : 0;

    result_index = (result.size() - c) * bits_in_word + msb_res % bits_in_word;
    result.m_wp   = (result.size() - c) - msb_res / bits_in_word;

    scfx_rep remainder = lhs;

    // align msb from remainder to msb from rhs
    remainder.lshift( to_shift );

    // make sure msw( remainder ) < size - 1
    if( remainder.m_msw == remainder.size() - 1 )
	remainder.resize_to( remainder.size() + 1, 1 );

    // make sure msw( remainder ) >= msw( rhs )!
    int msw_diff = rhs.m_msw - remainder.m_msw;
    if (msw_diff > 0)
	remainder.resize_to( remainder.size() + msw_diff, -1 );

    int counter;

    for( counter = div_wl; counter && ! remainder.is_zero(); counter -- )
    {
	if( compare_msw_ff( rhs, remainder ) <= 0 )
	{
	    result.set_bin( result_index );
	    sub_with_index( remainder.m_mant, remainder.m_msw, remainder.m_lsw,
			    rhs.m_mant, rhs.m_msw, rhs.m_lsw );
	}
	result_index --;
	remainder.shift_left( 1 );
        remainder.m_lsw = remainder.find_lsw();
    }

    // perform convergent rounding, if needed
    if( counter == 0 )
    {
	int index = result_index + 1 - result.m_wp * bits_in_word;

	scfx_index x = result.calc_indices( index );
	scfx_index x1 = result.calc_indices( index + 1 );

	if( result.o_bit_at( x ) && result.o_bit_at( x1 ) )
	    result.q_incr( x );

	result.m_r_flag = true;
    }

    result.find_sw();

    return &result;
}